

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_diff_values.h
# Opt level: O3

string * __thiscall
cute::diff_values<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
          (string *__return_storage_ptr__,cute *this,_CM_RETURN_STATUS *expected,
          _CM_RETURN_STATUS *actual,char *left,char *right)

{
  byte bVar1;
  _CM_RETURN_STATUS *t;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  string result;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  ulong local_60;
  long local_58;
  long lStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  char *local_40;
  _CM_RETURN_STATUS *local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cute_to_string::to_string<_CM_RETURN_STATUS>(&local_a8,(_CM_RETURN_STATUS *)this);
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = 0;
  local_40 = left;
  local_38 = expected;
  std::__cxx11::string::reserve((ulong)&local_c8);
  if (local_a8._M_string_length != 0) {
    uVar4 = 0;
    do {
      bVar1 = local_a8._M_dataplus._M_p[uVar4];
      if (bVar1 < 0xd) {
        if ((bVar1 != 9) && (bVar1 != 10)) goto LAB_0015087c;
LAB_0015088c:
        std::__cxx11::string::append((char *)&local_c8);
      }
      else {
        if ((bVar1 == 0xd) || (bVar1 == 0x5c)) goto LAB_0015088c;
LAB_0015087c:
        std::__cxx11::string::push_back((char)&local_c8);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_a8._M_string_length);
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x15ebcc);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  t = local_38;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cute_to_string::to_string<_CM_RETURN_STATUS>(&local_a8,t);
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = 0;
  std::__cxx11::string::reserve((ulong)&local_c8);
  if (local_a8._M_string_length != 0) {
    uVar4 = 0;
    do {
      bVar1 = local_a8._M_dataplus._M_p[uVar4];
      if (bVar1 < 0xd) {
        if ((bVar1 != 9) && (bVar1 != 10)) goto LAB_00150a8d;
LAB_00150a9d:
        std::__cxx11::string::append((char *)&local_c8);
      }
      else {
        if ((bVar1 == 0xd) || (bVar1 == 0x5c)) goto LAB_00150a9d;
LAB_00150a8d:
        std::__cxx11::string::push_back((char)&local_c8);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_a8._M_string_length);
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x15ebcc);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string diff_values(ExpectedValue const &expected
						, ActualValue const & actual
						, char const *left="expected"
						, char const *right="but was"){
		// construct a simple message...to be parsed by IDE support
		std::string res;
		res += ' ';
		res += left;
		res+=":\t" + cute_to_string::backslashQuoteTabNewline(cute_to_string::to_string(expected))+'\t';
		res += right;
		res +=":\t"+cute_to_string::backslashQuoteTabNewline(cute_to_string::to_string(actual))+'\t';
		return res;
	}